

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void miRegionOp(QRegionPrivate *dest,QRegionPrivate *reg1,QRegionPrivate *reg2,
               OverlapFunc overlapFunc,NonOverlapFunc nonOverlap1Func,NonOverlapFunc nonOverlap2Func
               )

{
  int iVar1;
  int iVar2;
  int iVar3;
  QRegionPrivate *pQVar4;
  const_pointer pQVar5;
  int *piVar6;
  long size;
  qsizetype qVar7;
  code *in_RCX;
  int *in_RDX;
  int *in_RSI;
  QList<QRect> *in_RDI;
  code *in_R8;
  code *in_R9;
  long in_FS_OFFSET;
  bool bVar8;
  int bot;
  int top;
  QRect *r2BandEnd;
  QRect *r1BandEnd;
  int curBand;
  int prevBand;
  int ytop;
  int ybot;
  QRect *r2End;
  QRect *r1End;
  QRect *r2;
  QRect *r1;
  QList<QRect> destRectsCopy;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  QRegionPrivate *in_stack_fffffffffffffe90;
  qsizetype in_stack_fffffffffffffe98;
  QList<QRect> *in_stack_fffffffffffffea0;
  QList<QRect> *in_stack_fffffffffffffed0;
  QRegionPrivate *in_stack_fffffffffffffed8;
  bool local_101;
  const_pointer local_d0;
  QRegionPrivate *local_c8;
  int local_b8;
  int local_b4;
  const_pointer local_a0;
  QRegionPrivate *local_98;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == 1) {
    local_98 = (QRegionPrivate *)(in_RSI + 8);
  }
  else {
    local_98 = (QRegionPrivate *)QList<QRect>::constData((QList<QRect> *)0x65635a);
  }
  if (*in_RDX == 1) {
    local_a0 = (const_pointer)(in_RDX + 8);
  }
  else {
    local_a0 = QList<QRect>::constData((QList<QRect> *)0x656396);
  }
  pQVar4 = (QRegionPrivate *)((Representation *)&local_98->numRects + (long)*in_RSI * 4);
  pQVar5 = local_a0 + *in_RDX;
  QRegionPrivate::vectorize(in_stack_fffffffffffffe90);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QRect>::QList((QList<QRect> *)in_stack_fffffffffffffe90,
                      (QList<QRect> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
  ;
  *(int *)&(in_RDI->d).d = 0;
  qMax<int>(in_RSI,in_RDX);
  QList<QRect>::resize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  iVar1 = QRect::top((QRect *)0x656491);
  iVar2 = QRect::top((QRect *)0x6564a9);
  if (iVar1 < iVar2) {
    local_b4 = QRect::top((QRect *)0x6564c7);
  }
  else {
    local_b4 = QRect::top((QRect *)0x6564e4);
  }
  local_b4 = local_b4 + -1;
  do {
    iVar1 = *(int *)&(in_RDI->d).d;
    local_c8 = local_98;
    while( true ) {
      bVar8 = false;
      if (local_c8 != pQVar4) {
        iVar2 = QRect::top((QRect *)0x656542);
        iVar3 = QRect::top((QRect *)0x656556);
        bVar8 = iVar2 == iVar3;
      }
      if (!bVar8) break;
      local_c8 = (QRegionPrivate *)&(local_c8->rects).d.ptr;
    }
    local_d0 = local_a0;
    while( true ) {
      bVar8 = false;
      if (local_d0 != pQVar5) {
        iVar2 = QRect::top((QRect *)0x6565c6);
        iVar3 = QRect::top((QRect *)0x6565da);
        bVar8 = iVar2 == iVar3;
      }
      if (!bVar8) break;
      local_d0 = local_d0 + 1;
    }
    iVar2 = QRect::top((QRect *)0x65661f);
    iVar3 = QRect::top((QRect *)0x656630);
    if (iVar2 < iVar3) {
      local_24 = QRect::top((QRect *)0x65664b);
      local_28 = local_b4 + 1;
      piVar6 = qMax<int>(&local_24,&local_28);
      iVar2 = *piVar6;
      local_2c = QRect::bottom((QRect *)0x65668e);
      local_30 = QRect::top((QRect *)0x6566a2);
      local_30 = local_30 + -1;
      piVar6 = qMin<int>(&local_2c,&local_30);
      if ((in_R8 != (code *)0x0) && (iVar2 <= *piVar6)) {
        (*in_R8)(in_RDI,local_98,local_c8,iVar2,*piVar6);
      }
      local_b8 = QRect::top((QRect *)0x656723);
    }
    else {
      iVar2 = QRect::top((QRect *)0x65673c);
      iVar3 = QRect::top((QRect *)0x65674d);
      if (iVar2 < iVar3) {
        local_34 = QRect::top((QRect *)0x656768);
        local_38 = local_b4 + 1;
        piVar6 = qMax<int>(&local_34,&local_38);
        iVar2 = *piVar6;
        local_3c = QRect::bottom((QRect *)0x6567ab);
        local_40 = QRect::top((QRect *)0x6567bf);
        local_40 = local_40 + -1;
        piVar6 = qMin<int>(&local_3c,&local_40);
        if ((in_R9 != (code *)0x0) && (iVar2 <= *piVar6)) {
          (*in_R9)(in_RDI,local_a0,local_d0,iVar2,*piVar6);
        }
        local_b8 = QRect::top((QRect *)0x656840);
      }
      else {
        local_b8 = QRect::top((QRect *)0x656856);
      }
    }
    if (*(int *)&(in_RDI->d).d != iVar1) {
      miCoalesce(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (int)in_stack_fffffffffffffed0);
    }
    local_44 = QRect::bottom((QRect *)0x6568a1);
    local_48 = QRect::bottom((QRect *)0x6568b5);
    piVar6 = qMin<int>(&local_44,&local_48);
    local_b4 = *piVar6;
    iVar1 = *(int *)&(in_RDI->d).d;
    if (local_b8 <= local_b4) {
      (*in_RCX)(in_RDI,local_98,local_c8,local_a0,local_d0,local_b8,local_b4);
    }
    if (*(int *)&(in_RDI->d).d != iVar1) {
      miCoalesce(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                 (int)in_stack_fffffffffffffed0);
    }
    iVar1 = QRect::bottom((QRect *)0x656983);
    if (iVar1 == local_b4) {
      local_98 = local_c8;
    }
    iVar1 = QRect::bottom((QRect *)0x6569a9);
    if (iVar1 == local_b4) {
      local_a0 = local_d0;
    }
    local_101 = local_98 != pQVar4 && local_a0 != pQVar5;
  } while (local_101);
  iVar1 = *(int *)&(in_RDI->d).d;
  if (local_98 == pQVar4) {
    if ((local_a0 != pQVar5) && (in_R9 != (code *)0x0)) {
      do {
        local_d0 = local_a0;
        while( true ) {
          bVar8 = false;
          if (local_d0 < pQVar5) {
            iVar2 = QRect::top((QRect *)0x656bd3);
            iVar3 = QRect::top((QRect *)0x656be4);
            bVar8 = iVar2 == iVar3;
          }
          if (!bVar8) break;
          local_d0 = local_d0 + 1;
        }
        in_stack_fffffffffffffea0 = in_RDI;
        local_54 = QRect::top((QRect *)0x656c54);
        local_58 = local_b4 + 1;
        piVar6 = qMax<int>(&local_54,&local_58);
        iVar2 = *piVar6;
        iVar3 = QRect::bottom((QRect *)0x656c94);
        (*in_R9)(in_stack_fffffffffffffea0,local_a0,local_d0,iVar2,iVar3);
        local_a0 = local_d0;
      } while (local_d0 != pQVar5);
    }
  }
  else if (in_R8 != (code *)0x0) {
    do {
      local_c8 = local_98;
      while( true ) {
        bVar8 = false;
        if (local_c8 < pQVar4) {
          iVar2 = QRect::top((QRect *)0x656a6c);
          iVar3 = QRect::top((QRect *)0x656a7d);
          bVar8 = iVar2 == iVar3;
        }
        if (!bVar8) break;
        local_c8 = (QRegionPrivate *)&(local_c8->rects).d.ptr;
      }
      in_stack_fffffffffffffed0 = in_RDI;
      local_4c = QRect::top((QRect *)0x656aed);
      local_50 = local_b4 + 1;
      piVar6 = qMax<int>(&local_4c,&local_50);
      iVar2 = *piVar6;
      iVar3 = QRect::bottom((QRect *)0x656b2d);
      (*in_R8)(in_stack_fffffffffffffed0,local_98,local_c8,iVar2,iVar3);
      in_stack_fffffffffffffed8 = local_98;
      local_98 = local_c8;
    } while (local_c8 != pQVar4);
  }
  if (*(int *)&(in_RDI->d).d != iVar1) {
    miCoalesce(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
               (int)in_stack_fffffffffffffed0);
  }
  local_5c = 4;
  piVar6 = qMax<int>(&local_5c,(int *)in_RDI);
  size = (long)*piVar6;
  qVar7 = QList<QRect>::size((QList<QRect> *)&(in_RDI->d).ptr);
  if (size < qVar7 >> 1) {
    QList<QRect>::resize(in_stack_fffffffffffffea0,size);
  }
  QList<QRect>::~QList((QList<QRect> *)0x656d7b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void miRegionOp(QRegionPrivate &dest,
                       const QRegionPrivate *reg1, const QRegionPrivate *reg2,
                       OverlapFunc overlapFunc, NonOverlapFunc nonOverlap1Func,
                       NonOverlapFunc nonOverlap2Func)
{
    const QRect *r1;         // Pointer into first region
    const QRect *r2;         // Pointer into 2d region
    const QRect *r1End;               // End of 1st region
    const QRect *r2End;               // End of 2d region
    int ybot;          // Bottom of intersection
    int ytop;          // Top of intersection
    int prevBand;               // Index of start of previous band in dest
    int curBand;                // Index of start of current band in dest
    const QRect *r1BandEnd;  // End of current band in r1
    const QRect *r2BandEnd;  // End of current band in r2
    int top;                    // Top of non-overlapping band
    int bot;                    // Bottom of non-overlapping band

    /*
     * Initialization:
     *  set r1, r2, r1End and r2End appropriately, preserve the important
     * parts of the destination region until the end in case it's one of
     * the two source regions, then mark the "new" region empty, allocating
     * another array of rectangles for it to use.
     */
    if (reg1->numRects == 1)
        r1 = &reg1->extents;
    else
        r1 = reg1->rects.constData();
    if (reg2->numRects == 1)
        r2 = &reg2->extents;
    else
        r2 = reg2->rects.constData();

    r1End = r1 + reg1->numRects;
    r2End = r2 + reg2->numRects;

    dest.vectorize();

    /*
     * The following calls are going to detach dest.rects. Since dest might be
     * aliasing *reg1 and/or *reg2, and we could have active iterators on
     * reg1->rects and reg2->rects (if the regions have more than 1 rectangle),
     * take a copy of dest.rects to keep those iteractors valid.
     */
    const QList<QRect> destRectsCopy = dest.rects;
    Q_UNUSED(destRectsCopy);

    dest.numRects = 0;

    /*
     * Allocate a reasonable number of rectangles for the new region. The idea
     * is to allocate enough so the individual functions don't need to
     * reallocate and copy the array, which is time consuming, yet we don't
     * have to worry about using too much memory. I hope to be able to
     * nuke the realloc() at the end of this function eventually.
     */
    dest.rects.resize(qMax(reg1->numRects,reg2->numRects) * 2);

    /*
     * Initialize ybot and ytop.
     * In the upcoming loop, ybot and ytop serve different functions depending
     * on whether the band being handled is an overlapping or non-overlapping
     * band.
     *  In the case of a non-overlapping band (only one of the regions
     * has points in the band), ybot is the bottom of the most recent
     * intersection and thus clips the top of the rectangles in that band.
     * ytop is the top of the next intersection between the two regions and
     * serves to clip the bottom of the rectangles in the current band.
     *  For an overlapping band (where the two regions intersect), ytop clips
     * the top of the rectangles of both regions and ybot clips the bottoms.
     */
    if (reg1->extents.top() < reg2->extents.top())
        ybot = reg1->extents.top() - 1;
    else
        ybot = reg2->extents.top() - 1;

    /*
     * prevBand serves to mark the start of the previous band so rectangles
     * can be coalesced into larger rectangles. qv. miCoalesce, above.
     * In the beginning, there is no previous band, so prevBand == curBand
     * (curBand is set later on, of course, but the first band will always
     * start at index 0). prevBand and curBand must be indices because of
     * the possible expansion, and resultant moving, of the new region's
     * array of rectangles.
     */
    prevBand = 0;

    do {
        curBand = dest.numRects;

        /*
         * This algorithm proceeds one source-band (as opposed to a
         * destination band, which is determined by where the two regions
         * intersect) at a time. r1BandEnd and r2BandEnd serve to mark the
         * rectangle after the last one in the current band for their
         * respective regions.
         */
        r1BandEnd = r1;
        while (r1BandEnd != r1End && r1BandEnd->top() == r1->top())
            ++r1BandEnd;

        r2BandEnd = r2;
        while (r2BandEnd != r2End && r2BandEnd->top() == r2->top())
            ++r2BandEnd;

        /*
         * First handle the band that doesn't intersect, if any.
         *
         * Note that attention is restricted to one band in the
         * non-intersecting region at once, so if a region has n
         * bands between the current position and the next place it overlaps
         * the other, this entire loop will be passed through n times.
         */
        if (r1->top() < r2->top()) {
            top = qMax(r1->top(), ybot + 1);
            bot = qMin(r1->bottom(), r2->top() - 1);

            if (nonOverlap1Func != nullptr && bot >= top)
                (*nonOverlap1Func)(dest, r1, r1BandEnd, top, bot);
            ytop = r2->top();
        } else if (r2->top() < r1->top()) {
            top = qMax(r2->top(), ybot + 1);
            bot = qMin(r2->bottom(), r1->top() - 1);

            if (nonOverlap2Func != nullptr && bot >= top)
                (*nonOverlap2Func)(dest, r2, r2BandEnd, top, bot);
            ytop = r1->top();
        } else {
            ytop = r1->top();
        }

        /*
         * If any rectangles got added to the region, try and coalesce them
         * with rectangles from the previous band. Note we could just do
         * this test in miCoalesce, but some machines incur a not
         * inconsiderable cost for function calls, so...
         */
        if (dest.numRects != curBand)
            prevBand = miCoalesce(dest, prevBand, curBand);

        /*
         * Now see if we've hit an intersecting band. The two bands only
         * intersect if ybot >= ytop
         */
        ybot = qMin(r1->bottom(), r2->bottom());
        curBand = dest.numRects;
        if (ybot >= ytop)
            (*overlapFunc)(dest, r1, r1BandEnd, r2, r2BandEnd, ytop, ybot);

        if (dest.numRects != curBand)
            prevBand = miCoalesce(dest, prevBand, curBand);

        /*
         * If we've finished with a band (y2 == ybot) we skip forward
         * in the region to the next band.
         */
        if (r1->bottom() == ybot)
            r1 = r1BandEnd;
        if (r2->bottom() == ybot)
            r2 = r2BandEnd;
    } while (r1 != r1End && r2 != r2End);

    /*
     * Deal with whichever region still has rectangles left.
     */
    curBand = dest.numRects;
    if (r1 != r1End) {
        if (nonOverlap1Func != nullptr) {
            do {
                r1BandEnd = r1;
                while (r1BandEnd < r1End && r1BandEnd->top() == r1->top())
                    ++r1BandEnd;
                (*nonOverlap1Func)(dest, r1, r1BandEnd, qMax(r1->top(), ybot + 1), r1->bottom());
                r1 = r1BandEnd;
            } while (r1 != r1End);
        }
    } else if ((r2 != r2End) && (nonOverlap2Func != nullptr)) {
        do {
            r2BandEnd = r2;
            while (r2BandEnd < r2End && r2BandEnd->top() == r2->top())
                 ++r2BandEnd;
            (*nonOverlap2Func)(dest, r2, r2BandEnd, qMax(r2->top(), ybot + 1), r2->bottom());
            r2 = r2BandEnd;
        } while (r2 != r2End);
    }

    if (dest.numRects != curBand)
        (void)miCoalesce(dest, prevBand, curBand);

    /*
     * A bit of cleanup. To keep regions from growing without bound,
     * we shrink the array of rectangles to match the new number of
     * rectangles in the region.
     *
     * Only do this stuff if the number of rectangles allocated is more than
     * twice the number of rectangles in the region (a simple optimization).
     */
    if (qMax(4, dest.numRects) < (dest.rects.size() >> 1))
        dest.rects.resize(dest.numRects);
}